

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector3 Vector3RotateByAxisAngle(Vector3 v,Vector3 axis,float angle)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector3 VVar11;
  undefined4 local_28;
  undefined4 uStack_24;
  
  fVar8 = axis.z;
  fVar4 = axis.x;
  fVar7 = axis.y;
  fVar6 = v.z;
  fVar2 = SQRT(fVar8 * fVar8 + fVar4 * fVar4 + fVar7 * fVar7);
  uVar1 = -(uint)(fVar2 == 0.0);
  fVar2 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar2));
  fVar3 = sinf(angle * 0.5);
  fVar4 = fVar2 * fVar4 * fVar3;
  fVar5 = cosf(angle * 0.5);
  fVar5 = fVar5 + fVar5;
  fVar10 = fVar3 * fVar2 * fVar7;
  fVar3 = fVar3 * fVar2 * fVar8;
  local_28 = v.x;
  uStack_24 = v.y;
  fVar2 = fVar6 * fVar10 - uStack_24 * fVar3;
  fVar8 = local_28 * fVar3 - fVar6 * fVar4;
  fVar9 = uStack_24 * fVar4 - fVar10 * local_28;
  fVar7 = fVar9 * fVar10 - fVar3 * fVar8;
  fVar3 = fVar2 * fVar3 - fVar4 * fVar9;
  VVar11.x = fVar5 * fVar2 + local_28 + fVar7 + fVar7;
  VVar11.y = fVar5 * fVar8 + uStack_24 + fVar3 + fVar3;
  VVar11.z = (fVar8 * fVar4 - fVar10 * fVar2) * 2.0 + fVar6 + fVar5 * fVar9;
  return VVar11;
}

Assistant:

RMAPI Vector3 Vector3RotateByAxisAngle(Vector3 v, Vector3 axis, float angle)
{
    // Using Euler-Rodrigues Formula
    // Ref.: https://en.wikipedia.org/w/index.php?title=Euler%E2%80%93Rodrigues_formula

    Vector3 result = v;

    // Vector3Normalize(axis);
    float length = sqrtf(axis.x*axis.x + axis.y*axis.y + axis.z*axis.z);
    if (length == 0.0f) length = 1.0f;
    float ilength = 1.0f/length;
    axis.x *= ilength;
    axis.y *= ilength;
    axis.z *= ilength;

    angle /= 2.0f;
    float a = sinf(angle);
    float b = axis.x*a;
    float c = axis.y*a;
    float d = axis.z*a;
    a = cosf(angle);
    Vector3 w = { b, c, d };

    // Vector3CrossProduct(w, v)
    Vector3 wv = { w.y*v.z - w.z*v.y, w.z*v.x - w.x*v.z, w.x*v.y - w.y*v.x };

    // Vector3CrossProduct(w, wv)
    Vector3 wwv = { w.y*wv.z - w.z*wv.y, w.z*wv.x - w.x*wv.z, w.x*wv.y - w.y*wv.x };

    // Vector3Scale(wv, 2*a)
    a *= 2;
    wv.x *= a;
    wv.y *= a;
    wv.z *= a;

    // Vector3Scale(wwv, 2)
    wwv.x *= 2;
    wwv.y *= 2;
    wwv.z *= 2;

    result.x += wv.x;
    result.y += wv.y;
    result.z += wv.z;

    result.x += wwv.x;
    result.y += wwv.y;
    result.z += wwv.z;

    return result;
}